

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QSize __thiscall QDockAreaLayoutInfo::size(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  QSize QVar2;
  
  bVar1 = isEmpty(this);
  if (bVar1) {
    QVar2.wd.m_i = 0;
    QVar2.ht.m_i = 0;
    return QVar2;
  }
  QVar2 = QRect::size(&this->rect);
  return QVar2;
}

Assistant:

QSize QDockAreaLayoutInfo::size() const
{
    return isEmpty() ? QSize(0, 0) : rect.size();
}